

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_transform_kernel_pack4_sse
               (Mat *kernel,Mat *kernel_tm_pack4,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  void *pvVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  undefined8 *puVar24;
  void *pvVar25;
  long lVar26;
  void *pvVar27;
  ulong uVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  int j;
  ulong uVar31;
  long lVar32;
  void *pvVar33;
  long lVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar37 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [32];
  float fVar46;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float tmp [8] [3];
  Mat local_e8;
  float fStack_98;
  undefined8 auStack_94 [3];
  undefined1 auStack_78 [72];
  
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  Mat::create(&local_e8,0x40,inch,outch,4,(Allocator *)0x0);
  auVar15 = _DAT_00519600;
  if (0 < outch) {
    pvVar11 = kernel->data;
    uVar28 = 0;
    pvVar27 = local_e8.data;
    do {
      if (0 < inch) {
        iVar19 = inch * 9 * (int)uVar28;
        uVar31 = 0;
        pvVar25 = pvVar27;
        do {
          fVar1 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4);
          fVar2 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 4);
          fVar3 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 8);
          fVar4 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 0xc);
          fVar5 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 0x10);
          fVar6 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 0x14);
          fVar7 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 0x18);
          fVar8 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 0x1c);
          fVar9 = *(float *)((long)pvVar11 + uVar31 * 0x24 + (long)iVar19 * 4 + 0x20);
          lVar32 = 0;
          do {
            auVar37 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00519780 + lVar32)),
                                    ZEXT416(*(uint *)((long)&DAT_0051978c + lVar32)),0x10);
            auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)((long)&DAT_00519798 + lVar32)),0x20);
            auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)((long)&DAT_005197a4 + lVar32)),0x30);
            auVar52 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00519784 + lVar32)),
                                    ZEXT416(*(uint *)((long)&DAT_00519790 + lVar32)),0x10);
            auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)((long)&DAT_0051979c + lVar32)),0x20);
            auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)((long)&DAT_005197a8 + lVar32)),0x30);
            fVar36 = auVar37._0_4_;
            fVar38 = auVar37._4_4_;
            fVar39 = auVar37._8_4_;
            fVar40 = auVar37._12_4_;
            fVar41 = auVar52._0_4_;
            fVar43 = auVar52._4_4_;
            fVar44 = auVar52._8_4_;
            fVar45 = auVar52._12_4_;
            auVar37 = vinsertps_avx(ZEXT416(*(uint *)((long)&DAT_00519788 + lVar32)),
                                    ZEXT416(*(uint *)((long)&DAT_00519790 + lVar32 + 4)),0x10);
            auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)((long)&DAT_005197a0 + lVar32)),0x20);
            auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)((long)&DAT_005197ac + lVar32)),0x30);
            fVar46 = auVar37._0_4_;
            fVar49 = auVar37._4_4_;
            fVar50 = auVar37._8_4_;
            fVar51 = auVar37._12_4_;
            auVar52._0_4_ = fVar41 * fVar2 + fVar36 * fVar1 + fVar46 * fVar3;
            auVar52._4_4_ = fVar43 * fVar2 + fVar38 * fVar1 + fVar49 * fVar3;
            auVar52._8_4_ = fVar44 * fVar2 + fVar39 * fVar1 + fVar50 * fVar3;
            auVar52._12_4_ = fVar45 * fVar2 + fVar40 * fVar1 + fVar51 * fVar3;
            auVar53._0_4_ = fVar41 * fVar5 + fVar36 * fVar4 + fVar46 * fVar6;
            auVar53._4_4_ = fVar43 * fVar5 + fVar38 * fVar4 + fVar49 * fVar6;
            auVar53._8_4_ = fVar44 * fVar5 + fVar39 * fVar4 + fVar50 * fVar6;
            auVar53._12_4_ = fVar45 * fVar5 + fVar40 * fVar4 + fVar51 * fVar6;
            auVar37._0_8_ =
                 CONCAT44(fVar8 * fVar43 + fVar38 * fVar7 + fVar9 * fVar49,
                          fVar8 * fVar41 + fVar36 * fVar7 + fVar9 * fVar46);
            auVar37._8_4_ = fVar8 * fVar44 + fVar39 * fVar7 + fVar9 * fVar50;
            auVar37._12_4_ = fVar8 * fVar45 + fVar40 * fVar7 + fVar9 * fVar51;
            auVar42._16_16_ = auVar53;
            auVar42._0_16_ = auVar52;
            auVar48 = vpermilps_avx(auVar42,auVar15);
            auVar47._16_16_ = auVar52;
            auVar47._0_16_ = auVar53;
            auVar42 = vmovsldup_avx(auVar47);
            auVar42 = vblendps_avx(auVar48,auVar42,0x42);
            auVar48._8_8_ = auVar37._0_8_;
            auVar48._0_8_ = auVar37._0_8_;
            auVar48._16_16_ = auVar37;
            auVar42 = vblendps_avx(auVar42,auVar48,0x24);
            auVar52 = vshufps_avx(auVar52,auVar53,0xff);
            auVar37 = vshufpd_avx(auVar37,auVar37,3);
            auVar37 = vblendps_avx(auVar37,auVar52,6);
            *(undefined1 (*) [16])(auStack_78 + lVar32) = auVar37;
            *(undefined1 (*) [32])((long)auStack_94 + lVar32 + -4) = auVar42;
            lVar32 = lVar32 + 0x30;
          } while (lVar32 != 0x60);
          lVar32 = 0;
          pvVar33 = pvVar25;
          do {
            fVar1 = *(float *)((long)auStack_94 + lVar32 * 0xc + -4);
            uVar10 = *(undefined8 *)((long)auStack_94 + lVar32 * 0xc);
            puVar24 = (undefined8 *)&DAT_00519784;
            lVar21 = 0;
            do {
              auVar35._0_4_ = (float)*puVar24 * (float)uVar10;
              auVar35._4_4_ = (float)((ulong)*puVar24 >> 0x20) * (float)((ulong)uVar10 >> 0x20);
              auVar35._8_8_ = 0;
              auVar37 = vmovshdup_avx(auVar35);
              *(float *)((long)pvVar33 + lVar21 * 4) =
                   auVar35._0_4_ + fVar1 * *(float *)((long)puVar24 + -4) + auVar37._0_4_;
              lVar21 = lVar21 + 1;
              puVar24 = (undefined8 *)((long)puVar24 + 0xc);
            } while (lVar21 != 8);
            lVar32 = lVar32 + 1;
            pvVar33 = (void *)((long)pvVar33 + 0x20);
          } while (lVar32 != 8);
          uVar31 = uVar31 + 1;
          pvVar25 = (void *)((long)pvVar25 +
                            (long)local_e8.w *
                            CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
        } while (uVar31 != (uint)inch);
      }
      uVar28 = uVar28 + 1;
      pvVar27 = (void *)((long)pvVar27 +
                        local_e8.cstep *
                        CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize));
    } while (uVar28 != (uint)outch);
  }
  iVar19 = inch + 3;
  if (-1 < inch) {
    iVar19 = inch;
  }
  iVar20 = outch + 3;
  if (-1 < outch) {
    iVar20 = outch;
  }
  Mat::create(kernel_tm_pack4,iVar19 >> 2,0x40,iVar20 >> 2,0x40,0x10,(Allocator *)0x0);
  if (3 < outch) {
    iVar19 = kernel_tm_pack4->w;
    pvVar11 = kernel_tm_pack4->data;
    sVar12 = kernel_tm_pack4->elemsize;
    sVar13 = kernel_tm_pack4->cstep;
    uVar28 = 0;
    do {
      lVar21 = local_e8.cstep * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      lVar32 = (long)local_e8.w * CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      puVar22 = (undefined4 *)(lVar21 * uVar28 + (long)local_e8.data);
      lVar34 = 0;
      do {
        if (3 < inch) {
          lVar16 = (long)pvVar11 + (long)iVar19 * sVar12 * lVar34 + (uVar28 >> 2) * sVar13 * sVar12;
          lVar26 = 0;
          puVar29 = puVar22;
          do {
            lVar23 = 0;
            puVar30 = puVar29;
            do {
              lVar17 = lVar16;
              lVar16 = 0;
              puVar18 = puVar30;
              do {
                *(undefined4 *)(lVar17 + lVar16) = *puVar18;
                puVar18 = (undefined4 *)((long)puVar18 + lVar21);
                lVar16 = lVar16 + 4;
              } while (lVar16 != 0x10);
              lVar23 = lVar23 + 1;
              puVar30 = (undefined4 *)((long)puVar30 + lVar32);
              lVar16 = lVar17 + 0x10;
            } while (lVar23 != 4);
            lVar23 = lVar26 + 7;
            puVar29 = puVar29 + lVar32;
            lVar16 = lVar17 + 0x10;
            lVar26 = lVar26 + 4;
          } while (lVar23 < inch);
        }
        lVar34 = lVar34 + 1;
        puVar22 = puVar22 + 1;
      } while (lVar34 != 0x40);
      uVar31 = uVar28 + 7;
      uVar28 = uVar28 + 4;
    } while (uVar31 < (uint)outch);
  }
  piVar14 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_kernel_pack4_sse(const Mat& kernel, Mat& kernel_tm_pack4, int inch, int outch, const Option& opt)
{
    // winograd63 transform kernel
    Mat kernel_tm;
    kernel_tm.create(8 * 8, inch, outch);

    const float ktm[8][3] = {
        {1.0f, 0.0f, 0.0f},
        {-2.0f / 9, -2.0f / 9, -2.0f / 9},
        {-2.0f / 9, 2.0f / 9, -2.0f / 9},
        {1.0f / 90, 1.0f / 45, 2.0f / 45},
        {1.0f / 90, -1.0f / 45, 2.0f / 45},
        {1.0f / 45, 1.0f / 90, 1.0f / 180},
        {1.0f / 45, -1.0f / 90, 1.0f / 180},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel, transposed
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[8][3];
            for (int i = 0; i < 8; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // v
            for (int j = 0; j < 8; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 8; i++)
                {
                    kernel_tm0[j * 8 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 64-inch-outch
    // dst = pb-pa-inch/pa-64-outch/pb
    kernel_tm_pack4.create(inch / 4, 64, outch / 4, (size_t)4u * 4 * 4, 4 * 4);

    for (int q = 0; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm_pack4.channel(q / 4);

        for (int k = 0; k < 64; k++)
        {
            float* g00 = g0.row<float>(k);

            for (int p = 0; p + 3 < inch; p += 4)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const float* k00 = kernel_tm.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
}